

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void Commands::HideImpl(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from,bool set)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  uint unsetflags;
  pointer pbVar3;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,",","");
  util::lowercase(&local_50,
                  (arguments->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  util::explode(&local_88,&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  unsetflags = 0;
  pbVar3 = local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar3 == local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      if (set) {
        Character::Hide(from,unsetflags);
      }
      else {
        Character::Unhide(from,unsetflags);
      }
      return;
    }
    iVar1 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar1 == 0) {
        uVar2 = 2;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar1 == 0) {
          uVar2 = 4;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)pbVar3);
          if (iVar1 == 0) {
            uVar2 = 8;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)pbVar3);
            if (iVar1 == 0) {
              uVar2 = 0x10;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)pbVar3);
              uVar2 = 0x1f;
              if (iVar1 != 0) {
                iVar1 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,"invalid_hide_flag","");
                I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var,iVar1) + 0x458),&local_a8);
                (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_88);
                return;
              }
            }
          }
        }
      }
    }
    unsetflags = unsetflags | uVar2 | ((unsetflags | uVar2) & 0xfffffffe) << 0x10;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void HideImpl(const std::vector<std::string>& arguments, Character* from, bool set)
{
	int flags = 0;

	for (const auto& flag : util::explode(",", util::lowercase(arguments[0])))
	{
		     if (flag == "invisible") flags |= Character::HideInvisible;
		else if (flag == "online")    flags |= Character::HideOnline;
		else if (flag == "npc")       flags |= Character::HideNpc;
		else if (flag == "admin")     flags |= Character::HideAdmin;
		else if (flag == "warp")      flags |= Character::HideWarp;
		else if (flag == "all")       flags |= Character::HideAll;
		else
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_hide_flag"));
			return;
		}

		int explicit_flags = (flags & ~Character::HideInvisible) << 16;
		flags |= explicit_flags;
	}

	if (set)
		from->Hide(flags);
	else
		from->Unhide(flags);
}